

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_cache_test.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::tools::NameCacheTests_test_names_Test::~NameCacheTests_test_names_Test
          (NameCacheTests_test_names_Test *this)

{
  (this->super_NameCacheTests).super_Test._vptr_Test = (_func_int **)&PTR__NameCacheTests_002a3aa8;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<int>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<int>_>_>_>
               *)&(this->super_NameCacheTests).name_cache_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x68);
  return;
}

Assistant:

TEST_F(NameCacheTests, test_names)
{
    name_cache_.NextID("Test");
    name_cache_.NextID("Test2");
    name_cache_.NextID("Test2");
    name_cache_.LastID("Test3");
    name_cache_.NextID("Test");
    std::set<std::string> expected = {"Test", "Test2"};
    EXPECT_EQ(expected, name_cache_.Names());
}